

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateIdentifier.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::AggregateIdentifier::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,AggregateIdentifier *this)

{
  ostream *poVar1;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  AggregateIdentifier *local_18;
  AggregateIdentifier *this_local;
  
  local_18 = this;
  this_local = (AggregateIdentifier *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  SimulationIdentifier::GetAsString_abi_cxx11_(&local_1c0,&this->super_SimulationIdentifier);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"Aggregate:   ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,*(ushort *)&(this->super_SimulationIdentifier).field_0xc)
  ;
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString AggregateIdentifier::GetAsString() const
{
    KStringStream ss;

    ss << SimulationIdentifier::GetAsString()
       << "Aggregate:   " << m_ui16AggregateID      << "\n";

    return ss.str();
}